

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  undefined1 auStack_2cf58 [3832];
  undefined8 uStack_2c060;
  undefined1 auStack_2c058 [86016];
  undefined1 auStack_17058 [94208];
  undefined1 local_58 [8];
  string arg;
  
  iVar5 = 0;
  do {
    if (argc <= iVar5) {
      if (interleaved != '\0') {
        textured = '\0';
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Using ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,nodeCount);
      poVar3 = std::operator<<(poVar3," nodes...");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"  --interleaved ....: ");
      pcVar6 = "no";
      pcVar4 = "no";
      if (interleaved != '\0') {
        pcVar4 = "yes";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"  --textured .......: ");
      if (textured != '\0') {
        pcVar6 = "yes";
      }
      poVar3 = std::operator<<(poVar3,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      rengine::AllocationPool<rengine::RectangleNode>::setMemory
                (&rengine::RectangleNode::__allocation_pool_rengine_RectangleNode,auStack_17058,
                 0x400);
      uStack_2c060 = 0x1141fd;
      rengine::AllocationPool<rengine::TextureNode>::setMemory
                (&rengine::TextureNode::__allocation_pool_rengine_TextureNode,auStack_2c058,0x400);
      rengine::AllocationPool<rengine::Node>::setMemory
                (&rengine::Node::__allocation_pool_rengine_Node,auStack_2cf58,0x40);
      rengine::rengine_main<Rectangles>(argc,argv);
      return 0;
    }
    std::__cxx11::string::string
              ((string *)local_58,argv[iVar5],(allocator *)(arg.field_2._M_local_buf + 0xf));
    iVar1 = iVar5 + 1;
    if (iVar1 < argc) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"--count");
      if (!bVar2) goto LAB_001140cc;
      nodeCount = atoi(argv[iVar1]);
      iVar5 = iVar5 + 2;
    }
    else {
LAB_001140cc:
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"--interleaved");
      iVar5 = iVar1;
      if (bVar2) {
        interleaved = '\x01';
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"--textured");
        if (bVar2) {
          textured = '\x01';
        }
      }
    }
    std::__cxx11::string::~string((string *)local_58);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (i < argc && arg == "--interleaved") {
            interleaved = true;
        } else if (i < argc && arg == "--textured") {
            textured = true;
        }
    }

    if (interleaved)
        textured = false;

    std::cout << "Using " << nodeCount << " nodes..." << std::endl;
    std::cout << "  --interleaved ....: " << (interleaved ? "yes" : "no") << std::endl;
    std::cout << "  --textured .......: " << (textured ? "yes" : "no") << std::endl;

    RENGINE_ALLOCATION_POOL(RectangleNode, rengine_RectangleNode, 1024);
    RENGINE_ALLOCATION_POOL(TextureNode, rengine_TextureNode, 1024);
    RENGINE_ALLOCATION_POOL(Node, rengine_Node, 64);
    rengine_main<Rectangles>(argc, argv);
    return 0;
}